

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls.c++
# Opt level: O0

int kj::TlsPrivateKey::passwordCallback(char *buf,int size,int rwflag,void *u)

{
  char *__dest;
  WiderType<Decay<unsigned_long>,_Decay<int_&>_> WVar1;
  char *__src;
  size_t local_50;
  int local_44;
  StringPtr *pSStack_40;
  int result;
  StringPtr *p;
  StringPtr *_p1040;
  Maybe<kj::StringPtr> *password;
  void *u_local;
  int rwflag_local;
  int size_local;
  char *buf_local;
  
  _p1040 = (StringPtr *)u;
  password = (Maybe<kj::StringPtr> *)u;
  u_local._0_4_ = rwflag;
  u_local._4_4_ = size;
  _rwflag_local = buf;
  pSStack_40 = kj::_::readMaybe<kj::StringPtr>((Maybe<kj::StringPtr> *)u);
  if (pSStack_40 == (StringPtr *)0x0) {
    buf_local._4_4_ = 0;
  }
  else {
    p = pSStack_40;
    local_50 = StringPtr::size(pSStack_40);
    WVar1 = min<unsigned_long,int&>(&local_50,(int *)((long)&u_local + 4));
    __dest = _rwflag_local;
    local_44 = (int)WVar1;
    __src = StringPtr::begin(pSStack_40);
    memcpy(__dest,__src,(long)local_44);
    buf_local._4_4_ = local_44;
  }
  return buf_local._4_4_;
}

Assistant:

int TlsPrivateKey::passwordCallback(char* buf, int size, int rwflag, void* u) {
  auto& password = *reinterpret_cast<kj::Maybe<kj::StringPtr>*>(u);

  KJ_IF_SOME(p, password) {
    int result = kj::min(p.size(), size);
    memcpy(buf, p.begin(), result);
    return result;
  } else {
    return 0;
  }
}